

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O3

void __thiscall
cmCacheManager::WritePropertyEntries(cmCacheManager *this,ostream *os,CacheIterator i)

{
  char *pcVar1;
  size_t sVar2;
  iterator iVar3;
  char **ppcVar4;
  string key;
  string helpstring;
  string local_a0;
  string local_80;
  _Base_ptr local_60;
  string local_58;
  CacheEntry *local_38;
  
  iVar3 = i.Position._M_node;
  if (PersistentProperties[0] != (char *)0x0) {
    local_60 = &((i.Container)->Cache)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_38 = (CacheEntry *)(iVar3._M_node + 2);
    ppcVar4 = PersistentProperties;
    pcVar1 = PersistentProperties[0];
    do {
      std::__cxx11::string::string((string *)&local_80,pcVar1,(allocator *)&local_a0);
      if (local_60 == iVar3._M_node) {
        pcVar1 = (char *)0x0;
      }
      else {
        pcVar1 = CacheEntry::GetProperty(local_38,&local_80);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
      }
      if (pcVar1 != (char *)0x0) {
        std::__cxx11::string::string((string *)&local_80,*ppcVar4,(allocator *)&local_a0);
        std::__cxx11::string::append((char *)&local_80);
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,*(long *)(iVar3._M_node + 1),
                   (long)&(iVar3._M_node[1]._M_parent)->_M_color + *(long *)(iVar3._M_node + 1));
        std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_a0._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        OutputHelpString(os,&local_80);
        local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,*(long *)(iVar3._M_node + 1),
                   (long)&(iVar3._M_node[1]._M_parent)->_M_color + *(long *)(iVar3._M_node + 1));
        std::__cxx11::string::append((char *)&local_a0);
        std::__cxx11::string::append((char *)&local_a0);
        OutputKey(os,&local_a0);
        std::__ostream_insert<char,std::char_traits<char>>(os,":INTERNAL=",10);
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        sVar2 = strlen(pcVar1);
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,pcVar1,pcVar1 + sVar2);
        OutputValue(os,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
          operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
        }
      }
      pcVar1 = ppcVar4[1];
      ppcVar4 = ppcVar4 + 1;
    } while (pcVar1 != (char *)0x0);
  }
  return;
}

Assistant:

void cmCacheManager::WritePropertyEntries(std::ostream& os, CacheIterator i)
{
  for (const char** p = this->PersistentProperties; *p; ++p) {
    if (const char* value = i.GetProperty(*p)) {
      std::string helpstring = *p;
      helpstring += " property for variable: ";
      helpstring += i.GetName();
      cmCacheManager::OutputHelpString(os, helpstring);

      std::string key = i.GetName();
      key += "-";
      key += *p;
      this->OutputKey(os, key);
      os << ":INTERNAL=";
      this->OutputValue(os, value);
      os << "\n";
    }
  }
}